

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDefaultVertexAttributeTests.cpp
# Opt level: O0

Vector<float,_4> __thiscall
deqp::gles3::Functional::(anonymous_namespace)::convertToTypeVec<float,4,float,4>
          (_anonymous_namespace_ *this,Vector<float,_4> *v)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar4;
  undefined4 local_20;
  undefined4 local_1c;
  int ndx_1;
  int ndx;
  Vector<float,_4> *v_local;
  Vector<float,_4> *retVal;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_1c);
    *pfVar3 = 0.0;
  }
  pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)this,3);
  *pfVar3 = 1.0;
  local_20 = 0;
  while( true ) {
    iVar2 = de::min<int>(4,4);
    if (iVar2 <= local_20) break;
    pfVar3 = tcu::Vector<float,_4>::operator[](v,local_20);
    fVar1 = *pfVar3;
    pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_20);
    *pfVar3 = fVar1;
    local_20 = local_20 + 1;
  }
  VVar4.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar4.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar4.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar4.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vector<float,_4>)VVar4.m_data;
}

Assistant:

tcu::Vector<T1, S1> convertToTypeVec (const tcu::Vector<T2, S2>& v)
{
	tcu::Vector<T1, S1> retVal;

	for (int ndx = 0; ndx < S1; ++ndx)
		retVal[ndx] = T1(0);

	if (S1 == 4)
		retVal[3] = T1(1);

	for (int ndx = 0; ndx < de::min(S1, S2); ++ndx)
		retVal[ndx] = T1(v[ndx]);

	return retVal;
}